

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O0

CScript * __thiscall CScript::operator<<(CScript *this,CScriptNum *b)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range;
  CScript *in_stack_ffffffffffffffb8;
  span<const_unsigned_char,_18446744073709551615UL> in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __range = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffd0;
  CScriptNum::getvch((CScriptNum *)__range);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>(in_RDI,__range);
  operator<<(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffd0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (CScript *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CScript& operator<<(const CScriptNum& b) LIFETIMEBOUND
    {
        *this << b.getvch();
        return *this;
    }